

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O3

void __thiscall
doctest::anon_unknown_15::JUnitReporter::JUnitTestCaseData::add
          (JUnitTestCaseData *this,string *classname,string *name)

{
  pointer *ppJVar1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *puVar4;
  pointer __a;
  pointer pJVar5;
  JUnitTestCase *__p;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  pointer pJVar9;
  undefined8 *puVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  long *plVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  pointer pJVar15;
  
  __a = (this->testcases).
        super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  if (__a == (this->testcases).
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pJVar5 = (this->testcases).
             super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)__a - (long)pJVar5 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    lVar7 = (long)__a - (long)pJVar5 >> 3;
    uVar13 = lVar7 * -0x1111111111111111;
    uVar8 = 1;
    if (__a != pJVar5) {
      uVar8 = uVar13;
    }
    uVar12 = uVar8 + uVar13;
    __args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               0x111111111111111;
    if (0x111111111111110 < uVar12) {
      uVar12 = 0x111111111111111;
    }
    if (CARRY8(uVar8,uVar13)) {
      uVar12 = 0x111111111111111;
    }
    if (uVar12 == 0) {
      pJVar9 = (pointer)0x0;
    }
    else {
      pJVar9 = (pointer)operator_new(uVar12 * 0x78);
    }
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)((long)&(pJVar9->classname)._M_dataplus + lVar7 * 8),
               (JUnitTestCase *)classname,name,__args_1);
    pJVar15 = pJVar9;
    if (__a != pJVar5) {
      lVar7 = 0;
      do {
        lVar14 = lVar7;
        puVar4 = (undefined8 *)((long)&(pJVar9->classname)._M_dataplus + lVar14);
        *puVar4 = puVar4 + 2;
        puVar2 = (undefined8 *)((long)&(pJVar5->classname)._M_dataplus._M_p + lVar14);
        plVar11 = puVar2 + 2;
        if (plVar11 == (long *)*puVar2) {
          uVar6 = puVar2[3];
          puVar4[2] = *plVar11;
          puVar4[3] = uVar6;
        }
        else {
          plVar3 = (long *)((long)&(pJVar9->classname)._M_dataplus + lVar14);
          *plVar3 = (long)*puVar2;
          plVar3[2] = *plVar11;
        }
        puVar4 = (undefined8 *)((long)&(pJVar5->classname)._M_dataplus._M_p + lVar14);
        puVar10 = puVar4 + 6;
        __p = (JUnitTestCase *)puVar4[1];
        puVar2 = (undefined8 *)((long)&(pJVar9->name).field_2 + lVar14);
        puVar2[-5] = __p;
        *puVar4 = plVar11;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar2[-2] = puVar2;
        if (puVar10 == (undefined8 *)puVar4[4]) {
          uVar6 = puVar4[7];
          *puVar2 = *puVar10;
          puVar2[1] = uVar6;
        }
        else {
          *(undefined8 **)((long)&(pJVar9->name)._M_dataplus + lVar14) = (undefined8 *)puVar4[4];
          *(undefined8 *)((long)&(pJVar9->name).field_2 + lVar14) = *puVar10;
        }
        *(undefined8 *)((long)&(pJVar9->name)._M_string_length + lVar14) =
             *(undefined8 *)((long)&(pJVar5->name)._M_string_length + lVar14);
        *(undefined8 **)((long)&(pJVar5->name)._M_dataplus._M_p + lVar14) = puVar10;
        *(undefined8 *)((long)&(pJVar5->name)._M_string_length + lVar14) = 0;
        (pJVar5->name).field_2._M_local_buf[lVar14] = '\0';
        *(undefined8 *)((long)&pJVar9->time + lVar14) =
             *(undefined8 *)((long)&pJVar5->time + lVar14);
        uVar6 = *(undefined8 *)
                 ((long)&(pJVar5->failures).
                         super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar14);
        puVar4 = (undefined8 *)
                 ((long)&(pJVar9->failures).
                         super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 + lVar14);
        *puVar4 = *(undefined8 *)
                   ((long)&(pJVar5->failures).
                           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar14);
        puVar4[1] = uVar6;
        *(undefined8 *)
         ((long)&(pJVar9->failures).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
         + lVar14 + 0x10U) =
             *(undefined8 *)
              ((long)&(pJVar5->failures).
                      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14);
        *(undefined8 *)
         ((long)&(pJVar5->failures).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) = 0;
        *(undefined8 *)
         ((long)&(pJVar5->failures).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar14) = 0;
        *(undefined8 *)
         ((long)&(pJVar5->failures).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_finish + lVar14) = 0;
        uVar6 = *(undefined8 *)
                 ((long)&(pJVar5->errors).
                         super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                         ._M_impl.super__Vector_impl_data._M_finish + lVar14);
        puVar4 = (undefined8 *)
                 ((long)&(pJVar9->errors).
                         super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 + lVar14);
        *puVar4 = *(undefined8 *)
                   ((long)&(pJVar5->errors).
                           super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar14);
        puVar4[1] = uVar6;
        *(undefined8 *)
         ((long)&(pJVar9->errors).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
         + lVar14 + 0x10U) =
             *(undefined8 *)
              ((long)&(pJVar5->errors).
                      super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14);
        *(undefined8 *)
         ((long)&(pJVar5->errors).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar14) = 0;
        *(undefined8 *)
         ((long)&(pJVar5->errors).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar14) = 0;
        *(undefined8 *)
         ((long)&(pJVar5->errors).
                 super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestMessage>_>
                 ._M_impl.super__Vector_impl_data._M_finish + lVar14) = 0;
        std::
        allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
        ::destroy<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>
                  ((allocator_type *)((long)&(pJVar5->classname)._M_dataplus._M_p + lVar14),__p);
        lVar7 = lVar14 + 0x78;
      } while ((pointer)((long)&pJVar5[1].classname._M_dataplus._M_p + lVar14) != __a);
      pJVar15 = (pointer)((long)&pJVar9[1].classname._M_dataplus + lVar14);
    }
    if (pJVar5 != (pointer)0x0) {
      operator_delete(pJVar5,(long)(this->testcases).
                                   super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pJVar5
                     );
    }
    (this->testcases).
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
    ._M_impl.super__Vector_impl_data._M_start = pJVar9;
    (this->testcases).
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
    ._M_impl.super__Vector_impl_data._M_finish = pJVar15 + 1;
    (this->testcases).
    super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pJVar9 + uVar12;
  }
  else {
    std::
    allocator_traits<std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>>
    ::
    construct<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((allocator_type *)__a,(JUnitTestCase *)classname,name,in_RCX);
    ppJVar1 = &(this->testcases).
               super__Vector_base<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase,_std::allocator<doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::JUnitTestCase>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppJVar1 = *ppJVar1 + 1;
  }
  return;
}

Assistant:

void add(const std::string& classname, const std::string& name) {
                testcases.emplace_back(classname, name);
            }